

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Value::removeMember(Value *this,char *key)

{
  bool bVar1;
  runtime_error *this_00;
  iterator __position;
  long in_RSI;
  Value *in_RDI;
  iterator it;
  CZString actualKey;
  Value *old;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffff68;
  CZString *this_01;
  char *in_stack_ffffffffffffff78;
  CZString *in_stack_ffffffffffffff80;
  _Self local_48;
  _Self local_40;
  Value *in_stack_ffffffffffffffc8;
  Value *in_stack_ffffffffffffffd0;
  
  if (((*(ushort *)(in_RSI + 8) & 0xff) != 0) && ((*(ushort *)(in_RSI + 8) & 0xff) != 7)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"in Json::Value::removeMember(): requires objectValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(ushort *)(in_RSI + 8) & 0xff) == 0) {
    Value(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    this_01 = (CZString *)&stack0xffffffffffffffc8;
    CZString::CZString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                       (DuplicationPolicy)((ulong)this_01 >> 0x20));
    __position = std::
                 map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 ::find(in_stack_ffffffffffffff68,(key_type *)0x12a21c);
    local_40._M_node = __position._M_node;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator==(&local_40,&local_48);
    if (bVar1) {
      Value(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x12a296
                );
      Value(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      std::
      map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
      ::erase_abi_cxx11_((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                          *)this_01,__position);
    }
    CZString::~CZString(this_01);
  }
  return in_RDI;
}

Assistant:

Value Value::removeMember(const char* key) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == objectValue,
                      "in Json::Value::removeMember(): requires objectValue");
  if (type_ == nullValue)
    return null;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  CZString actualKey(key, CZString::noDuplication);
  ObjectValues::iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end())
    return null;
  Value old(it->second);
  value_.map_->erase(it);
  return old;
#else
  Value* value = value_.map_->find(key);
  if (value) {
    Value old(*value);
    value_.map_.remove(key);
    return old;
  } else {
    return null;
  }
#endif
}